

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

DnsPrefixEntry * __thiscall
BinHash<DnsPrefixEntry>::DoInsert
          (BinHash<DnsPrefixEntry> *this,DnsPrefixEntry *key,bool need_alloc,bool *stored)

{
  uint32_t uVar1;
  int iVar2;
  DnsPrefixEntry *pDVar3;
  DnsPrefixEntry *pDVar4;
  
  *stored = false;
  pDVar3 = (DnsPrefixEntry *)0x0;
  if ((key != (DnsPrefixEntry *)0x0) && (this->tableSize != 0)) {
    uVar1 = DnsPrefixEntry::Hash(key);
    pDVar4 = (DnsPrefixEntry *)(this->hashBin + (ulong)uVar1 % (ulong)this->tableSize);
    pDVar3 = pDVar4;
    do {
      pDVar3 = pDVar3->HashNext;
      if (pDVar3 == (DnsPrefixEntry *)0x0) {
        if (need_alloc) {
          return (DnsPrefixEntry *)0x0;
        }
        key->HashNext = pDVar4->HashNext;
        pDVar4->HashNext = key;
        *stored = true;
        this->tableCount = this->tableCount + 1;
        return key;
      }
      iVar2 = strcmp(key->dnsPrefix,pDVar3->dnsPrefix);
    } while (iVar2 != 0);
    *stored = false;
  }
  return pDVar3;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }